

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O2

t_int * phasor_perform(t_int *w)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  t_int tVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  lVar2 = w[1];
  lVar3 = w[2];
  lVar4 = w[3];
  dVar8 = *(double *)(lVar2 + 0x30) + 1572864.0;
  tVar5 = w[4];
  fVar1 = *(float *)(lVar2 + 0x38);
  for (lVar6 = 0; (int)tVar5 != (int)lVar6; lVar6 = lVar6 + 1) {
    uVar7 = (ulong)dVar8 & 0xffffffff;
    dVar8 = dVar8 + (double)(*(float *)(lVar3 + lVar6 * 4) * fVar1);
    *(float *)(lVar4 + lVar6 * 4) = (float)((double)(uVar7 | 0x4138000000000000) + -1572864.0);
  }
  *(double *)(lVar2 + 0x30) = (double)((ulong)dVar8 & 0xffffffff | 0x4138000000000000) + -1572864.0;
  return w + 5;
}

Assistant:

static t_int *phasor_perform(t_int *w)
{
    t_phasor *x = (t_phasor *)(w[1]);
    t_sample *in = (t_float *)(w[2]);
    t_sample *out = (t_float *)(w[3]);
    int n = (int)(w[4]);
    double dphase = x->x_phase + (double)UNITBIT32;
    union tabfudge tf;
    int normhipart;
    t_float conv = x->x_conv;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];
    tf.tf_d = dphase;

    while (n--)
    {
        tf.tf_i[HIOFFSET] = normhipart;
        dphase += *in++ * conv;
        *out++ = tf.tf_d - UNITBIT32;
        tf.tf_d = dphase;
    }
    tf.tf_i[HIOFFSET] = normhipart;
    x->x_phase = tf.tf_d - UNITBIT32;
    return (w+5);
}